

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SkipCommentAndWhitespaceAndNewline
          (AsciiParser *this,bool allow_semicolon)

{
  ulong uVar1;
  int *piVar2;
  byte bVar3;
  uint8_t uVar4;
  bool bVar5;
  StreamReader *pSVar6;
  uint64_t *puVar7;
  ulong uVar8;
  ulong uVar9;
  
  pSVar6 = this->_sr;
  uVar9 = pSVar6->length_;
  uVar8 = pSVar6->idx_;
  if (uVar8 < uVar9) {
    do {
      puVar7 = &pSVar6->idx_;
      bVar3 = pSVar6->binary_[uVar8];
      if (bVar3 == 0) {
        return true;
      }
      uVar1 = uVar8 + 1;
      *puVar7 = uVar1;
      if (bVar3 < 0x20) {
        if ((bVar3 != 9) && (bVar3 != 0xc)) {
LAB_0035acf3:
          if (bVar3 != 0x3b || !allow_semicolon) {
            if (bVar3 == 0xd) {
              if (uVar1 < uVar9 - 1) {
                uVar4 = pSVar6->binary_[uVar8 + 1];
                *puVar7 = uVar8 + 2;
                if (uVar4 != '\n') {
                  if ((long)(uVar8 + 2) < 1) {
                    return false;
                  }
                  if (uVar9 <= uVar8) {
                    return false;
                  }
                  *puVar7 = uVar1;
                }
              }
            }
            else if (bVar3 != 10) {
              if (uVar8 <= uVar9 && uVar8 < 0x7fffffffffffffff) {
                *puVar7 = uVar8;
                return true;
              }
              return false;
            }
            (this->_curr_cursor).col = 0;
            (this->_curr_cursor).row = (this->_curr_cursor).row + 1;
            goto LAB_0035ad04;
          }
        }
LAB_0035ad00:
        piVar2 = &(this->_curr_cursor).col;
        *piVar2 = *piVar2 + 1;
      }
      else {
        if (bVar3 == 0x20) goto LAB_0035ad00;
        if (bVar3 != 0x23) goto LAB_0035acf3;
        bVar5 = SkipUntilNewline(this);
        if (!bVar5) {
          return false;
        }
        pSVar6 = this->_sr;
      }
LAB_0035ad04:
      uVar9 = pSVar6->length_;
      uVar8 = pSVar6->idx_;
    } while (uVar8 < uVar9);
  }
  return true;
}

Assistant:

bool AsciiParser::SkipCommentAndWhitespaceAndNewline(
    const bool allow_semicolon) {
  // Skip multiple line of comments.
  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    // printf("sws c = %c\n", c);

    if (c == '#') {
      if (!SkipUntilNewline()) {
        return false;
      }
    } else if ((c == ' ') || (c == '\t') || (c == '\f')) {
      _curr_cursor.col++;
      // continue
    } else if (allow_semicolon && (c == ';')) {
      _curr_cursor.col++;
      // continue
    } else if (c == '\n') {
      _curr_cursor.col = 0;
      _curr_cursor.row++;
      // continue
    } else if (c == '\r') {
      // CRLF?
      if (_sr->tell() < (_sr->size() - 1)) {
        char d;
        if (!Char1(&d)) {
          // this should not happen.
          return false;
        }

        if (d == '\n') {
          // CRLF
        } else {
          // unwind 1 char
          if (!_sr->seek_from_current(-1)) {
            // this should not happen.
            return false;
          }
        }
      }
      _curr_cursor.col = 0;
      _curr_cursor.row++;
      // continue
    } else {
      // std::cout << "unwind\n";
      // end loop
      if (!_sr->seek_from_current(-1)) {
        return false;
      }
      break;
    }
  }

  return true;
}